

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::DisneyMaterial::readFrom(DisneyMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(binary,&this->anisotropic);
  BinaryReader::read<float,void>(binary,&this->clearCoat);
  BinaryReader::read<float,void>(binary,&this->clearCoatGloss);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->color);
  BinaryReader::read<float,void>(binary,&this->diffTrans);
  BinaryReader::read<float,void>(binary,&this->eta);
  BinaryReader::read<float,void>(binary,&this->flatness);
  BinaryReader::read<float,void>(binary,&this->metallic);
  BinaryReader::read<float,void>(binary,&this->roughness);
  BinaryReader::read<float,void>(binary,&this->sheen);
  BinaryReader::read<float,void>(binary,&this->sheenTint);
  BinaryReader::read<float,void>(binary,&this->specTrans);
  BinaryReader::read<float,void>(binary,&this->specularTint);
  BinaryReader::read<bool,void>(binary,&this->thin);
  return;
}

Assistant:

void DisneyMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(anisotropic);
    binary.read(clearCoat);
    binary.read(clearCoatGloss);
    binary.read(color);
    binary.read(diffTrans);
    binary.read(eta);
    binary.read(flatness);
    binary.read(metallic);
    binary.read(roughness);
    binary.read(sheen);
    binary.read(sheenTint);
    binary.read(specTrans);
    binary.read(specularTint);
    binary.read(thin);
  }